

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O0

Fad<Fad<double>_> * __thiscall
Fad<Fad<double>>::operator+=
          (Fad<Fad<double>_> *this,
          FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
          *x)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Fad<Fad<double>_> *in_RDI;
  int i_3;
  int i_2;
  Fad<double> *dxp_1;
  int i_1;
  int i;
  Fad<double> *dxp;
  int sz;
  int xsz;
  Fad<double> *in_stack_fffffffffffffed8;
  Fad<double> *in_stack_fffffffffffffee0;
  Fad<double> *this_00;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
  *in_stack_fffffffffffffee8;
  Fad<double> *in_stack_ffffffffffffff10;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
  local_d0 [2];
  int local_ac;
  int in_stack_ffffffffffffff6c;
  Vector<Fad<double>_> *in_stack_ffffffffffffff70;
  int local_84;
  int local_58;
  int local_24;
  
  iVar2 = FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
          ::size((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
                  *)0x1e90051);
  iVar3 = Vector<Fad<double>_>::size((Vector<Fad<double>_> *)0x1e90066);
  if (iVar2 != 0) {
    if (iVar3 == 0) {
      Vector<Fad<double>_>::resize(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
      Vector<Fad<double>_>::begin(&in_RDI->dx_);
      bVar1 = FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
              ::hasFastAccess((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
                               *)0x1e9024b);
      if (bVar1) {
        for (local_84 = 0; local_84 < iVar2; local_84 = local_84 + 1) {
          FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
          ::fastAccessDx(in_stack_fffffffffffffee8,(int)((ulong)in_stack_fffffffffffffee0 >> 0x20));
          Fad<double>::operator=(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
          Fad<double>::~Fad(in_stack_fffffffffffffee0);
        }
      }
      else {
        for (local_ac = 0; local_ac < iVar2; local_ac = local_ac + 1) {
          FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
          ::dx(local_d0,(int)((ulong)in_stack_fffffffffffffee0 >> 0x20));
          Fad<double>::operator=(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
          Fad<double>::~Fad(in_stack_fffffffffffffee0);
        }
      }
    }
    else {
      Vector<Fad<double>_>::begin(&in_RDI->dx_);
      bVar1 = FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
              ::hasFastAccess((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
                               *)0x1e900ac);
      if (bVar1) {
        for (local_24 = 0; local_24 < iVar3; local_24 = local_24 + 1) {
          FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
          ::fastAccessDx(in_stack_fffffffffffffee8,(int)((ulong)in_stack_fffffffffffffee0 >> 0x20));
          Fad<double>::operator+=<double,_nullptr>(in_stack_ffffffffffffff10,(Fad<double> *)in_RDI);
          Fad<double>::~Fad(in_stack_fffffffffffffee0);
        }
      }
      else {
        for (local_58 = 0; local_58 < iVar3; local_58 = local_58 + 1) {
          FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
          ::dx(in_stack_fffffffffffffee8,(int)((ulong)in_stack_fffffffffffffee0 >> 0x20));
          Fad<double>::operator+=<double,_nullptr>(in_stack_ffffffffffffff10,(Fad<double> *)in_RDI);
          Fad<double>::~Fad(in_stack_fffffffffffffee0);
        }
      }
    }
  }
  this_00 = (Fad<double> *)&stack0xffffffffffffff10;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
  ::val((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
         *)in_stack_fffffffffffffed8);
  Fad<double>::operator+=<double,_nullptr>(in_stack_ffffffffffffff10,(Fad<double> *)in_RDI);
  Fad<double>::~Fad(this_00);
  return in_RDI;
}

Assistant:

inline  Fad<T> & Fad<T>::operator+= (const FadExpr<ExprT>& x)
{
  int xsz = x.size(), sz = dx_.size();

  if (xsz) {
    if (sz) {
      T* RESTRICT dxp = dx_.begin();
      if (x.hasFastAccess())
	for (int i=0; i<sz; ++i)
	  dxp[i] += x.fastAccessDx(i);
      else
	for (int i=0; i<sz; ++i)
	  dxp[i] += x.dx(i);
    }
    else {
      dx_.resize(xsz);
      T* RESTRICT dxp = dx_.begin();
      if (x.hasFastAccess())
	for (int i=0; i<xsz; ++i)
	  dxp[i] = x.fastAccessDx(i);
      else
	for (int i=0; i<xsz; ++i)
	  dxp[i] = x.dx(i);
    }
  }

  val_ += x.val();

  return *this;
}